

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::Serialize(ProcessStatsConfig *this,Message *msg)

{
  bool bVar1;
  reference pPVar2;
  void *data;
  size_t size;
  ProcessStatsConfig_Quirks *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  *__range2;
  Message *msg_local;
  ProcessStatsConfig *this_local;
  
  __end2 = std::
           vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ::begin(&this->quirks_);
  it = (ProcessStatsConfig_Quirks *)
       std::
       vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
       ::end(&this->quirks_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::ProcessStatsConfig_Quirks_*,_std::vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>_>
                                     *)&it), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::ProcessStatsConfig_Quirks_*,_std::vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>_>
             ::operator*(&__end2);
    protozero::Message::AppendVarInt<perfetto::protos::gen::ProcessStatsConfig_Quirks>
              (msg,1,*pPVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::ProcessStatsConfig_Quirks_*,_std::vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)(this->scan_all_processes_on_start_ & 1));
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)(this->record_thread_names_ & 1));
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,4,this->proc_stats_poll_ms_);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->proc_stats_cache_ttl_ms_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void ProcessStatsConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: quirks
  for (auto& it : quirks_) {
    msg->AppendVarInt(1, it);
  }

  // Field 2: scan_all_processes_on_start
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, scan_all_processes_on_start_);
  }

  // Field 3: record_thread_names
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, record_thread_names_);
  }

  // Field 4: proc_stats_poll_ms
  if (_has_field_[4]) {
    msg->AppendVarInt(4, proc_stats_poll_ms_);
  }

  // Field 6: proc_stats_cache_ttl_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, proc_stats_cache_ttl_ms_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}